

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

void __thiscall
google::protobuf::internal::EpsCopyInputStream::BackUp(EpsCopyInputStream *this,char *ptr)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  ushort *ptr_00;
  long in_RCX;
  MessageLite *this_00;
  EpsCopyInputStream *this_01;
  ulong in_R8;
  ushort *puStack_c8;
  EpsCopyInputStream EStack_c0;
  undefined4 uStack_68;
  int iStack_64;
  undefined8 uStack_60;
  undefined8 uStack_58;
  
  pcVar1 = this->buffer_end_ + 0x10;
  if (ptr <= pcVar1) {
    uVar3 = ((int)this->buffer_end_ - (int)ptr) + this->size_;
    if (this->next_chunk_ == this->patch_buffer_) {
      uVar3 = (int)pcVar1 - (int)ptr;
    }
    if (0 < (int)uVar3) {
      (*this->zcis_->_vptr_ZeroCopyInputStream[3])(this->zcis_,(ulong)uVar3);
      this->overall_limit_ = this->overall_limit_ + uVar3;
    }
    return;
  }
  this_01 = (EpsCopyInputStream *)&stack0xffffffffffffffe0;
  BackUp(this_01);
  EStack_c0.zcis_ = (ZeroCopyInputStream *)0x0;
  EStack_c0.patch_buffer_[0] = '\0';
  EStack_c0.patch_buffer_[1] = '\0';
  EStack_c0.patch_buffer_[2] = '\0';
  EStack_c0.patch_buffer_[3] = '\0';
  EStack_c0.patch_buffer_[4] = '\0';
  EStack_c0.patch_buffer_[5] = '\0';
  EStack_c0.patch_buffer_[6] = '\0';
  EStack_c0.patch_buffer_[7] = '\0';
  EStack_c0.patch_buffer_[8] = '\0';
  EStack_c0.patch_buffer_[9] = '\0';
  EStack_c0.patch_buffer_[10] = '\0';
  EStack_c0.patch_buffer_[0xb] = '\0';
  EStack_c0.patch_buffer_[0xc] = '\0';
  EStack_c0.patch_buffer_[0xd] = '\0';
  EStack_c0.patch_buffer_[0xe] = '\0';
  EStack_c0.patch_buffer_[0xf] = '\0';
  EStack_c0.patch_buffer_[0x10] = '\0';
  EStack_c0.patch_buffer_[0x11] = '\0';
  EStack_c0.patch_buffer_[0x12] = '\0';
  EStack_c0.patch_buffer_[0x13] = '\0';
  EStack_c0.patch_buffer_[0x14] = '\0';
  EStack_c0.patch_buffer_[0x15] = '\0';
  EStack_c0.patch_buffer_[0x16] = '\0';
  EStack_c0.patch_buffer_[0x17] = '\0';
  EStack_c0.patch_buffer_[0x18] = '\0';
  EStack_c0.patch_buffer_[0x19] = '\0';
  EStack_c0.patch_buffer_[0x1a] = '\0';
  EStack_c0.patch_buffer_[0x1b] = '\0';
  EStack_c0.patch_buffer_[0x1c] = '\0';
  EStack_c0.patch_buffer_[0x1d] = '\0';
  EStack_c0.patch_buffer_[0x1e] = '\0';
  EStack_c0.patch_buffer_[0x1f] = '\0';
  EStack_c0.aliasing_ = 1;
  EStack_c0.last_tag_minus_1_ = 0;
  EStack_c0.overall_limit_ = 0x7fffffff;
  uStack_68 = io::CodedInputStream::default_recursion_limit_;
  iStack_64 = -0x80000000;
  uStack_60 = 0;
  uStack_58 = 0;
  puStack_c8 = (ushort *)InitFrom(&EStack_c0,(ZeroCopyInputStream *)this_01,(int)ptr);
  while (bVar2 = DoneWithCheck(&EStack_c0,(char **)&puStack_c8,iStack_64), !bVar2) {
    uVar3 = (uint)*(byte *)(in_RCX + 8) & (uint)*puStack_c8;
    if ((uVar3 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
    uVar4 = (ulong)(uVar3 & 0xfffffff8);
    puStack_c8 = (ushort *)
                 (**(code **)(in_RCX + 0x38 + uVar4 * 2))
                           (this_00,puStack_c8,&EStack_c0,
                            (ulong)*puStack_c8 ^ *(ulong *)(in_RCX + 0x40 + uVar4 * 2),in_RCX,0);
    if ((puStack_c8 == (ushort *)0x0) || (EStack_c0.last_tag_minus_1_ != 0)) break;
  }
  ptr_00 = puStack_c8;
  if ((*(byte *)(in_RCX + 9) & 1) != 0) {
    ptr_00 = (ushort *)(**(code **)(in_RCX + 0x28))(this_00,puStack_c8,&EStack_c0);
  }
  if (ptr_00 != (ushort *)0x0) {
    BackUp(&EStack_c0,(char *)ptr_00);
    if ((EStack_c0.last_tag_minus_1_ == 0) && ((in_R8 & 2) == 0)) {
      MessageLite::IsInitializedWithErrors(this_00);
    }
  }
  return;
}

Assistant:

void BackUp(const char* ptr) {
    ABSL_DCHECK(ptr <= buffer_end_ + kSlopBytes);
    int count;
    if (next_chunk_ == patch_buffer_) {
      count = static_cast<int>(buffer_end_ + kSlopBytes - ptr);
    } else {
      count = size_ + static_cast<int>(buffer_end_ - ptr);
    }
    if (count > 0) StreamBackUp(count);
  }